

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

void cmsys::SystemTools::AddTranslationPath(string *a,string *b)

{
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *this;
  bool bVar1;
  __type _Var2;
  long lVar3;
  string path_b;
  string path_a;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  
  std::__cxx11::string::string((string *)&path_a,(string *)a);
  std::__cxx11::string::string((string *)&path_b,(string *)b);
  ConvertToUnixSlashes(&path_a);
  ConvertToUnixSlashes(&path_b);
  bVar1 = FileIsDirectory(&path_a);
  if (((bVar1) && (path_b._M_string_length != 0)) &&
     ((*path_b._M_dataplus._M_p == '~' || (*path_b._M_dataplus._M_p == '/')))) {
    lVar3 = std::__cxx11::string::find((char *)&path_b,0x1150af);
    if (lVar3 == -1) {
      if ((path_a._M_string_length != 0) &&
         (path_a._M_dataplus._M_p[path_a._M_string_length - 1] != '/')) {
        std::__cxx11::string::push_back((char)&path_a);
      }
      if ((path_b._M_string_length != 0) &&
         (path_b._M_dataplus._M_p[path_b._M_string_length - 1] != '/')) {
        std::__cxx11::string::push_back((char)&path_b);
      }
      _Var2 = std::operator==(&path_a,&path_b);
      this = TranslationMap;
      if (!_Var2) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  (&local_48,&path_a,&path_b);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                  (this,&local_48);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(&local_48);
      }
    }
  }
  std::__cxx11::string::~string((string *)&path_b);
  std::__cxx11::string::~string((string *)&path_a);
  return;
}

Assistant:

void SystemTools::AddTranslationPath(const std::string& a,
                                     const std::string& b)
{
  std::string path_a = a;
  std::string path_b = b;
  SystemTools::ConvertToUnixSlashes(path_a);
  SystemTools::ConvertToUnixSlashes(path_b);
  // First check this is a directory path, since we don't want the table to
  // grow too fat
  if (SystemTools::FileIsDirectory(path_a)) {
    // Make sure the path is a full path and does not contain no '..'
    // Ken--the following code is incorrect. .. can be in a valid path
    // for example  /home/martink/MyHubba...Hubba/Src
    if (SystemTools::FileIsFullPath(path_b) &&
        path_b.find("..") == std::string::npos) {
      // Before inserting make sure path ends with '/'
      if (!path_a.empty() && *path_a.rbegin() != '/') {
        path_a += '/';
      }
      if (!path_b.empty() && *path_b.rbegin() != '/') {
        path_b += '/';
      }
      if (!(path_a == path_b)) {
        SystemTools::TranslationMap->insert(
          SystemToolsTranslationMap::value_type(path_a, path_b));
      }
    }
  }
}